

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

int Pdr_InvCheck(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose)

{
  int iVar1;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  int RetValue;
  int fVerbose_local;
  Vec_Int_t *vInv_local;
  Gia_Man_t *p_local;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  iVar1 = sat_solver_nvars(s);
  if (iVar1 == p_00->nVars) {
    Cnf_DataFree(p_00);
    iVar1 = Pdr_InvCheck_int(p,vInv,fVerbose,s,0);
    sat_solver_delete(s);
    return iVar1;
  }
  __assert_fail("sat_solver_nvars(pSat) == pCnf->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrInv.c"
                ,0x31a,"int Pdr_InvCheck(Gia_Man_t *, Vec_Int_t *, int)");
}

Assistant:

int Pdr_InvCheck( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose )
{
    int RetValue;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    assert( sat_solver_nvars(pSat) == pCnf->nVars );
    Cnf_DataFree( pCnf );
    RetValue = Pdr_InvCheck_int( p, vInv, fVerbose, pSat, 0 );
    sat_solver_delete( pSat );
    return RetValue;
}